

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O0

void __thiscall llvm::Twine::printRepr(Twine *this,raw_ostream *OS)

{
  Child CVar1;
  NodeKind NVar2;
  raw_ostream *OS_local;
  Twine *this_local;
  
  raw_ostream::operator<<(OS,"(Twine ");
  CVar1 = this->LHS;
  NVar2 = getLHSKind(this);
  printOneChildRepr(this,OS,CVar1,NVar2);
  raw_ostream::operator<<(OS," ");
  CVar1 = this->RHS;
  NVar2 = getRHSKind(this);
  printOneChildRepr(this,OS,CVar1,NVar2);
  raw_ostream::operator<<(OS,")");
  return;
}

Assistant:

void Twine::printRepr(raw_ostream &OS) const {
  OS << "(Twine ";
  printOneChildRepr(OS, LHS, getLHSKind());
  OS << " ";
  printOneChildRepr(OS, RHS, getRHSKind());
  OS << ")";
}